

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
VariableData::VariableData
          (VariableData *this,Allocator *allocator,SynBase *source,ScopeData *scope,uint alignment,
          TypeBase *type,SynIdentifier *name,uint offset,uint uniqueId)

{
  uint uVar1;
  TypeBase *type_local;
  uint alignment_local;
  ScopeData *scope_local;
  SynBase *source_local;
  Allocator *allocator_local;
  VariableData *this_local;
  
  this->source = source;
  this->scope = scope;
  this->alignment = alignment;
  this->type = type;
  this->name = name;
  this->offset = offset;
  this->uniqueId = uniqueId;
  SmallArray<VmConstant_*,_8U>::SmallArray(&this->users,allocator);
  SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::SmallDenseMap(&this->offsetUsers,allocator);
  SmallArray<RegVmLoweredInstruction_*,_4U>::SmallArray(&this->regVmUsers,allocator);
  this->importModule = (ModuleData *)0x0;
  uVar1 = InplaceStr::hash(&name->name);
  this->nameHash = uVar1;
  this->isReference = false;
  this->isReadonly = false;
  this->usedAsExternal = false;
  this->lookupOnly = false;
  this->isAlloca = false;
  this->isVmAlloca = false;
  this->isVmRegSpill = false;
  if ((alignment != 0) && (offset % alignment != 0)) {
    __assert_fail("offset % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                  ,0xc2,
                  "VariableData::VariableData(Allocator *, SynBase *, ScopeData *, unsigned int, TypeBase *, SynIdentifier *, unsigned int, unsigned int)"
                 );
  }
  return;
}

Assistant:

VariableData(Allocator *allocator, SynBase *source, ScopeData *scope, unsigned alignment, TypeBase *type, SynIdentifier *name, unsigned offset, unsigned uniqueId): source(source), scope(scope), alignment(alignment), type(type), name(name), offset(offset), uniqueId(uniqueId), users(allocator), offsetUsers(allocator), regVmUsers(allocator)
	{
		importModule = NULL;

		nameHash = name->name.hash();

		isReference = false;
		isReadonly = false;

		usedAsExternal = false;

		lookupOnly = false;

		isAlloca = false;
		isVmAlloca = false;

		isVmRegSpill = false;

		if(alignment != 0)
			assert(offset % alignment == 0);
	}